

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_rows(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_context *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar4;
  
  _Var1 = ggml_is_matrix(in_RSI);
  if (((_Var1) && (_Var1 = ggml_is_vector(in_RDX), _Var1)) && (in_RDX->type == GGML_TYPE_I32)) {
    bVar4 = 0;
    if ((in_RSI->grad == (ggml_tensor *)0x0) && (in_RDX->grad == (ggml_tensor *)0x0)) {
      pgVar2 = ggml_new_tensor_2d((ggml_context *)(ulong)in_stack_ffffffffffffffe0,
                                  (ggml_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                                  (int)in_stack_ffffffffffffffd8,
                                  (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      pgVar2->op = GGML_OP_GET_ROWS;
      if ((bVar4 & 1) == 0) {
        pgVar3 = (ggml_tensor *)0x0;
      }
      else {
        pgVar3 = ggml_dup_tensor(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      pgVar2->grad = pgVar3;
      pgVar2->src0 = in_RSI;
      pgVar2->src1 = in_RDX;
      return pgVar2;
    }
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf9b,
            "false");
    abort();
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf96,
          "ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32");
  abort();
}

Assistant:

struct ggml_tensor * ggml_get_rows(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32);

    bool is_node = false;

    if (a->grad || b->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    // TODO: implement non F32 return
    //struct ggml_tensor * result = ggml_new_tensor_2d(ctx, a->type, a->ne[0], b->ne[0]);
    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, a->ne[0], b->ne[0]);

    result->op   = GGML_OP_GET_ROWS;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}